

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int ARKodeResize(void *arkode_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  int line;
  long liw_diff;
  char *msgfmt;
  long lrw_diff;
  double dVar2;
  sunindextype liw1;
  sunindextype lrw1;
  long local_58;
  long local_50;
  double local_48;
  undefined8 uStack_40;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    iVar1 = -0x15;
    line = 0x5a;
  }
  else if (*(int *)((long)arkode_mem + 0x388) == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
    line = 99;
  }
  else if (y0 == (N_Vector)0x0) {
    msgfmt = "y0 = NULL illegal.";
    iVar1 = -0x16;
    line = 0x6b;
  }
  else {
    *(sunrealtype *)((long)arkode_mem + 0x2d0) = t0;
    *(sunrealtype *)((long)arkode_mem + 0x360) = t0;
    local_48 = (double)(~-(ulong)(hscale < 0.0) & (ulong)hscale |
                       -(ulong)(hscale < 0.0) & 0x3ff0000000000000);
    if ((local_48 != 1.0) || (NAN(local_48))) {
      *(double *)((long)arkode_mem + 0x2c8) = local_48;
      dVar2 = *(double *)((long)arkode_mem + 0x2b8) * local_48;
      *(double *)((long)arkode_mem + 0x2b8) = dVar2;
      if ((*(int *)((long)arkode_mem + 0x288) != 0) &&
         (0.0 < ((dVar2 + t0) - *(double *)((long)arkode_mem + 0x290)) * dVar2)) {
        dVar2 = (*(double *)((long)arkode_mem + 8) * -4.0 + 1.0) *
                (*(double *)((long)arkode_mem + 0x290) - t0);
        *(double *)((long)arkode_mem + 0x2b8) = dVar2;
        *(double *)((long)arkode_mem + 0x2c8) = dVar2 / *(double *)((long)arkode_mem + 0x2a0);
      }
    }
    uStack_40 = 0;
    local_58 = 0;
    local_50 = 0;
    if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(y0,&local_50,&local_58);
    }
    lrw_diff = local_50 - *(long *)((long)arkode_mem + 0x338);
    liw_diff = local_58 - *(long *)((long)arkode_mem + 0x340);
    *(long *)((long)arkode_mem + 0x338) = local_50;
    *(long *)((long)arkode_mem + 0x340) = local_58;
    iVar1 = arkResizeVectors((ARKodeMem)arkode_mem,resize,resize_data,lrw_diff,liw_diff,y0);
    if (iVar1 == 0) {
      msgfmt = "Unable to resize vector";
      iVar1 = -0x14;
      line = 0x97;
    }
    else {
      if ((*(ARKInterp *)((long)arkode_mem + 0x278) == (ARKInterp)0x0) ||
         (iVar1 = arkInterpResize((ARKodeMem_conflict)arkode_mem,
                                  *(ARKInterp *)((long)arkode_mem + 0x278),resize,resize_data,
                                  lrw_diff,liw_diff,y0), iVar1 == 0)) {
        N_VScale(0x3ff0000000000000,y0,*(undefined8 *)((long)arkode_mem + 0x230));
        *(undefined4 *)((long)arkode_mem + 0x240) = 0;
        *(undefined4 *)((long)arkode_mem + 0x80) = 0;
        *(undefined8 *)((long)arkode_mem + 0x38c) = 0x200000001;
        *(undefined4 *)((long)arkode_mem + 0x394) = 1;
        if (*(code **)((long)arkode_mem + 0xc0) == (code *)0x0) {
          return 0;
        }
        iVar1 = (**(code **)((long)arkode_mem + 0xc0))(local_48,t0,arkode_mem,y0,resize,resize_data)
        ;
        return iVar1;
      }
      msgfmt = "Interpolation module resize failure";
      line = 0xa3;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,iVar1,line,"ARKodeResize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int ARKodeResize(void* arkode_mem, N_Vector y0, sunrealtype hscale,
                 sunrealtype t0, ARKVecResizeFn resize, void* resize_data)
{
  sunbooleantype resizeOK;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;
  ARKodeMem ark_mem;

  /* Check ark_mem */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKODE state */
  ark_mem->tcur = t0;
  ark_mem->tn   = t0;

  /* Update time-stepping parameters */
  /*   adjust upcoming step size depending on hscale */
  if (hscale < ZERO) { hscale = ONE; }
  if (hscale != ONE)
  {
    /* Encode hscale into ark_mem structure */
    ark_mem->eta = hscale;
    ark_mem->hprime *= hscale;

    /* If next step would overtake tstop, adjust stepsize */
    if (ark_mem->tstopset)
    {
      if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->hprime >
          ZERO)
      {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                          (ONE - FOUR * ark_mem->uround);
        ark_mem->eta = ark_mem->hprime / ark_mem->h;
      }
    }
  }

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the solver vectors (using y0 as a template) */
  resizeOK = arkResizeVectors(ark_mem, resize, resize_data, lrw_diff, liw_diff,
                              y0);
  if (!resizeOK)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Unable to resize vector");
    return (ARK_MEM_FAIL);
  }

  /* Resize the interpolation structure memory */
  if (ark_mem->interp != NULL)
  {
    retval = arkInterpResize(ark_mem, ark_mem->interp, resize, resize_data,
                             lrw_diff, liw_diff, y0);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                      "Interpolation module resize failure");
      return (retval);
    }
  }

  /* Copy y0 into ark_yn to set the current solution */
  N_VScale(ONE, y0, ark_mem->yn);
  ark_mem->fn_is_current = SUNFALSE;

  /* Disable constraints */
  ark_mem->constraintsSet = SUNFALSE;

  /* Indicate that problem needs to be initialized */
  ark_mem->initsetup  = SUNTRUE;
  ark_mem->init_type  = RESIZE_INIT;
  ark_mem->firststage = SUNTRUE;

  /* Call the stepper-specific resize (if provided) */
  if (ark_mem->step_resize)
  {
    return (ark_mem->step_resize(ark_mem, y0, hscale, t0, resize, resize_data));
  }

  /* Problem has been successfully re-sized */
  return (ARK_SUCCESS);
}